

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O2

_Bool linear_strcat(void *parent,char **dest,char *str)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  sVar1 = strlen(str);
  if ((dest != (char **)0x0) && (pcVar3 = *dest, pcVar3 != (char *)0x0)) {
    sVar2 = strlen(pcVar3);
    pcVar3 = (char *)linear_realloc(parent,pcVar3,(int)sVar2 + (int)sVar1 + 1);
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3 + (sVar2 & 0xffffffff),str,sVar1 & 0xffffffff);
      pcVar3[(uint)((int)sVar1 + (int)sVar2)] = '\0';
      *dest = pcVar3;
    }
    return pcVar3 != (char *)0x0;
  }
  __assert_fail("dest != NULL && *dest != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                ,0x387,"_Bool linear_cat(void *, char **, const char *, unsigned int)");
}

Assistant:

static bool
cat(char **dest, const char *str, size_t n)
{
   char *both;
   size_t existing_length;
   assert(dest != NULL && *dest != NULL);

   existing_length = strlen(*dest);
   both = resize(*dest, existing_length + n + 1);
   if (unlikely(both == NULL))
      return false;

   memcpy(both + existing_length, str, n);
   both[existing_length + n] = '\0';

   *dest = both;
   return true;
}